

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O2

NodeRecord * __thiscall
embree::sse2::CreateMortonLeaf<4,_embree::InstancePrimitive>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<4,_embree::InstancePrimitive> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  uint uVar3;
  FastAllocator *this_00;
  ThreadLocal *pTVar4;
  ThreadLocal2 *this_01;
  Instance *pIVar5;
  AffineSpace3ff *pAVar6;
  long lVar7;
  MutexSys *pMVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  char *pcVar31;
  ulong uVar32;
  size_t sVar33;
  MutexSys *pMVar34;
  ulong uVar35;
  MutexSys *pMVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar39;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar40;
  float fVar41;
  float fVar44;
  float fVar45;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  float fVar62;
  float fVar66;
  float fVar67;
  undefined1 auVar63 [16];
  float fVar68;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float local_a8;
  float local_88;
  float fStack_84;
  Lock<embree::MutexSys> local_78;
  MutexSys *local_68;
  Lock<embree::MutexSys> local_60;
  ThreadLocal2 *local_50 [4];
  
  uVar37 = (ulong)(current->_end - current->_begin);
  pMVar34 = (MutexSys *)(uVar37 << 4);
  this_00 = alloc->alloc;
  pTVar4 = alloc->talloc1;
  this_01 = pTVar4->parent;
  local_68 = pMVar34;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_60.locked = true;
    local_60.mutex = &this_01->mutex;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_78.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    local_78.locked = true;
    local_50[0] = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,local_50);
    Lock<embree::MutexSys>::~Lock(&local_78);
    Lock<embree::MutexSys>::~Lock(&local_60);
  }
  pMVar36 = local_68;
  pTVar4->bytesUsed = (long)&local_68->mutex + pTVar4->bytesUsed;
  sVar33 = pTVar4->cur;
  uVar35 = (ulong)(-(int)sVar33 & 0xf);
  uVar32 = (long)&local_68->mutex + uVar35 + sVar33;
  pTVar4->cur = uVar32;
  if (pTVar4->end < uVar32) {
    pTVar4->cur = sVar33;
    pMVar8 = (MutexSys *)pTVar4->allocBlockSize;
    if ((MutexSys *)((long)local_68 * 4) < pMVar8 || (long)local_68 * 4 - (long)pMVar8 == 0) {
      local_78.mutex = pMVar8;
      pcVar31 = (char *)FastAllocator::malloc(this_00,(size_t)&local_78);
      pTVar4->ptr = pcVar31;
      sVar33 = (pTVar4->end - pTVar4->cur) + pTVar4->bytesWasted;
      pTVar4->bytesWasted = sVar33;
      pTVar4->end = (size_t)local_78.mutex;
      pTVar4->cur = (size_t)pMVar36;
      if (local_78.mutex < pMVar36) {
        pTVar4->cur = 0;
        local_78.mutex = (MutexSys *)pTVar4->allocBlockSize;
        pcVar31 = (char *)FastAllocator::malloc(this_00,(size_t)&local_78);
        pTVar4->ptr = pcVar31;
        sVar33 = (pTVar4->end - pTVar4->cur) + pTVar4->bytesWasted;
        pTVar4->bytesWasted = sVar33;
        pTVar4->end = (size_t)local_78.mutex;
        pTVar4->cur = (size_t)pMVar36;
        if (local_78.mutex < pMVar36) {
          pTVar4->cur = 0;
          pcVar31 = (char *)0x0;
          goto LAB_00463444;
        }
      }
      pTVar4->bytesWasted = sVar33;
    }
    else {
      pcVar31 = (char *)FastAllocator::malloc(this_00,(size_t)&local_68);
    }
  }
  else {
    pTVar4->bytesWasted = pTVar4->bytesWasted + uVar35;
    pcVar31 = pTVar4->ptr + (uVar32 - (long)local_68);
  }
LAB_00463444:
  auVar30 = _DAT_01f45a30;
  pIVar5 = this->mesh;
  auVar38 = _DAT_01f45a30;
  aVar40 = _DAT_01f45a40;
  for (pMVar36 = (MutexSys *)0x0; pMVar34 != pMVar36; pMVar36 = pMVar36 + 2) {
    pAVar6 = pIVar5->local2world;
    if ((pIVar5->super_Geometry).field_8.field_0x1 == '\x01') {
      fVar41 = (pAVar6->p).field_0.m128[3];
      fVar44 = (pAVar6->l).vx.field_0.m128[3];
      fVar45 = (pAVar6->l).vy.field_0.m128[3];
      fVar50 = (pAVar6->l).vz.field_0.m128[3];
      aVar2 = (pAVar6->l).vx.field_0.field_1;
      fVar78 = (pAVar6->l).vy.field_0.m128[0];
      fVar80 = (pAVar6->l).vy.field_0.m128[1];
      fVar56 = fVar44 * fVar45 + fVar41 * fVar50;
      fVar49 = fVar44 * fVar45 - fVar41 * fVar50;
      fVar58 = fVar41 * fVar41 + fVar44 * fVar44 + -fVar45 * fVar45 + -fVar50 * fVar50;
      fVar82 = fVar41 * fVar41 - fVar44 * fVar44;
      fVar60 = fVar45 * fVar45 + fVar82 + -fVar50 * fVar50;
      fVar46 = fVar44 * fVar50 - fVar41 * fVar45;
      fVar54 = fVar41 * fVar45 + fVar44 * fVar50;
      fVar51 = fVar45 * fVar50 + fVar41 * fVar44;
      fVar77 = fVar45 * fVar50 - fVar41 * fVar44;
      fVar48 = fVar50 * fVar50 + fVar82 + -fVar45 * fVar45;
      fVar41 = (pAVar6->l).vz.field_0.m128[0];
      fVar44 = (pAVar6->l).vz.field_0.m128[1];
      fVar45 = (pAVar6->l).vz.field_0.m128[2];
      fVar56 = fVar56 + fVar56;
      fVar46 = fVar46 + fVar46;
      fVar50 = (pAVar6->p).field_0.m128[0];
      fVar82 = (pAVar6->p).field_0.m128[1];
      fVar47 = (pAVar6->p).field_0.m128[2];
      fVar49 = fVar49 + fVar49;
      fVar51 = fVar51 + fVar51;
      fVar54 = fVar54 + fVar54;
      fVar77 = fVar77 + fVar77;
      fVar79 = fVar58 * 1.0 + fVar56 * 0.0 + fVar46 * 0.0;
      fVar81 = fVar58 * 0.0 + fVar56 * 1.0 + fVar46 * 0.0;
      fVar52 = fVar58 * 0.0 + fVar56 * 0.0 + fVar46 * 1.0;
      fVar53 = fVar58 * 0.0 + fVar56 * 0.0 + fVar46 * 0.0;
      fVar56 = fVar49 * 1.0 + fVar60 * 0.0 + fVar51 * 0.0;
      fVar58 = fVar49 * 0.0 + fVar60 * 1.0 + fVar51 * 0.0;
      fVar59 = fVar49 * 0.0 + fVar60 * 0.0 + fVar51 * 1.0;
      fVar60 = fVar49 * 0.0 + fVar60 * 0.0 + fVar51 * 0.0;
      fVar66 = fVar54 * 1.0 + fVar77 * 0.0 + fVar48 * 0.0;
      fVar67 = fVar54 * 0.0 + fVar77 * 1.0 + fVar48 * 0.0;
      fVar68 = fVar54 * 0.0 + fVar77 * 0.0 + fVar48 * 1.0;
      fVar77 = fVar54 * 0.0 + fVar77 * 0.0 + fVar48 * 0.0;
      local_a8 = aVar2.x;
      fVar46 = local_a8 * fVar79 + fVar56 * 0.0 + fVar66 * 0.0;
      fVar48 = local_a8 * fVar81 + fVar58 * 0.0 + fVar67 * 0.0;
      fVar49 = local_a8 * fVar52 + fVar59 * 0.0 + fVar68 * 0.0;
      fVar51 = local_a8 * fVar53 + fVar60 * 0.0 + fVar77 * 0.0;
      local_88 = aVar2.y;
      fStack_84 = aVar2.z;
      fVar55 = fVar78 * fVar79 + fVar80 * fVar56 + fVar66 * 0.0;
      fVar62 = fVar78 * fVar81 + fVar80 * fVar58 + fVar67 * 0.0;
      fVar72 = fVar78 * fVar52 + fVar80 * fVar59 + fVar68 * 0.0;
      fVar75 = fVar78 * fVar53 + fVar80 * fVar60 + fVar77 * 0.0;
      fVar76 = fVar41 * fVar79 + fVar44 * fVar56 + fVar45 * fVar66;
      fVar84 = fVar41 * fVar81 + fVar44 * fVar58 + fVar45 * fVar67;
      fVar83 = fVar41 * fVar52 + fVar44 * fVar59 + fVar45 * fVar68;
      fVar85 = fVar41 * fVar53 + fVar44 * fVar60 + fVar45 * fVar77;
      fVar44 = fVar50 * fVar79 + fVar82 * fVar56 + fVar47 * fVar66 + local_88 + 0.0;
      fVar78 = fVar50 * fVar81 + fVar82 * fVar58 + fVar47 * fVar67 + fStack_84 + 0.0;
      fVar80 = fVar50 * fVar52 + fVar82 * fVar59 + fVar47 * fVar68 +
               (pAVar6->l).vy.field_0.m128[2] + 0.0;
      fVar47 = fVar50 * fVar53 + fVar82 * fVar60 + fVar47 * fVar77 + 0.0;
      lVar7 = *(long *)&(pIVar5->super_Geometry).field_0x58;
      auVar42 = minps(*(undefined1 (*) [16])(lVar7 + 0x10),*(undefined1 (*) [16])(lVar7 + 0x30));
      auVar61 = maxps(*(undefined1 (*) [16])(lVar7 + 0x20),*(undefined1 (*) [16])(lVar7 + 0x40));
      fVar60 = auVar42._0_4_;
      fVar67 = auVar42._4_4_;
      fVar41 = auVar42._8_4_;
      fVar66 = fVar41 * fVar76 + fVar44;
      fVar68 = fVar41 * fVar84 + fVar78;
      fVar69 = fVar41 * fVar83 + fVar80;
      fVar70 = fVar41 * fVar85 + fVar47;
      fVar71 = fVar67 * fVar55;
      fVar73 = fVar67 * fVar62;
      fVar74 = fVar67 * fVar72;
      fVar67 = fVar67 * fVar75;
      fVar77 = fVar71 + fVar66;
      fVar79 = fVar73 + fVar68;
      fVar81 = fVar74 + fVar69;
      fVar52 = fVar67 + fVar70;
      fVar56 = fVar60 * fVar46;
      fVar58 = fVar60 * fVar48;
      fVar59 = fVar60 * fVar49;
      fVar60 = fVar60 * fVar51;
      fVar41 = fVar56 + fVar77;
      fVar45 = fVar58 + fVar79;
      fVar50 = fVar59 + fVar81;
      fVar82 = fVar60 + fVar52;
      auVar42._4_4_ = fVar45;
      auVar42._0_4_ = fVar41;
      auVar42._8_4_ = fVar50;
      auVar42._12_4_ = fVar82;
      auVar42 = minps(auVar30,auVar42);
      auVar63._4_4_ = fVar45;
      auVar63._0_4_ = fVar41;
      auVar63._8_4_ = fVar50;
      auVar63._12_4_ = fVar82;
      auVar63 = maxps((undefined1  [16])_DAT_01f45a40,auVar63);
      fVar53 = auVar61._0_4_;
      fVar54 = auVar61._4_4_;
      fVar41 = auVar61._8_4_;
      fVar44 = fVar41 * fVar76 + fVar44;
      fVar78 = fVar41 * fVar84 + fVar78;
      fVar80 = fVar41 * fVar83 + fVar80;
      fVar47 = fVar41 * fVar85 + fVar47;
      fVar71 = fVar71 + fVar44;
      fVar73 = fVar73 + fVar78;
      fVar74 = fVar74 + fVar80;
      fVar67 = fVar67 + fVar47;
      fVar41 = fVar56 + fVar71;
      fVar45 = fVar58 + fVar73;
      fVar50 = fVar59 + fVar74;
      fVar82 = fVar60 + fVar67;
      auVar18._4_4_ = fVar45;
      auVar18._0_4_ = fVar41;
      auVar18._8_4_ = fVar50;
      auVar18._12_4_ = fVar82;
      auVar42 = minps(auVar42,auVar18);
      auVar19._4_4_ = fVar45;
      auVar19._0_4_ = fVar41;
      auVar19._8_4_ = fVar50;
      auVar19._12_4_ = fVar82;
      auVar63 = maxps(auVar63,auVar19);
      fVar55 = fVar54 * fVar55;
      fVar62 = fVar54 * fVar62;
      fVar72 = fVar54 * fVar72;
      fVar54 = fVar54 * fVar75;
      fVar66 = fVar66 + fVar55;
      fVar68 = fVar68 + fVar62;
      fVar69 = fVar69 + fVar72;
      fVar70 = fVar70 + fVar54;
      fVar41 = fVar56 + fVar66;
      fVar45 = fVar58 + fVar68;
      fVar50 = fVar59 + fVar69;
      fVar82 = fVar60 + fVar70;
      auVar20._4_4_ = fVar45;
      auVar20._0_4_ = fVar41;
      auVar20._8_4_ = fVar50;
      auVar20._12_4_ = fVar82;
      auVar42 = minps(auVar42,auVar20);
      auVar21._4_4_ = fVar45;
      auVar21._0_4_ = fVar41;
      auVar21._8_4_ = fVar50;
      auVar21._12_4_ = fVar82;
      auVar63 = maxps(auVar63,auVar21);
      fVar55 = fVar55 + fVar44;
      fVar62 = fVar62 + fVar78;
      fVar72 = fVar72 + fVar80;
      fVar54 = fVar54 + fVar47;
      fVar56 = fVar56 + fVar55;
      fVar58 = fVar58 + fVar62;
      fVar59 = fVar59 + fVar72;
      fVar60 = fVar60 + fVar54;
      auVar61._4_4_ = fVar58;
      auVar61._0_4_ = fVar56;
      auVar61._8_4_ = fVar59;
      auVar61._12_4_ = fVar60;
      auVar42 = minps(auVar42,auVar61);
      auVar15._4_4_ = fVar58;
      auVar15._0_4_ = fVar56;
      auVar15._8_4_ = fVar59;
      auVar15._12_4_ = fVar60;
      auVar63 = maxps(auVar63,auVar15);
      fVar46 = fVar53 * fVar46;
      fVar48 = fVar53 * fVar48;
      fVar49 = fVar53 * fVar49;
      fVar53 = fVar53 * fVar51;
      fVar77 = fVar77 + fVar46;
      fVar79 = fVar79 + fVar48;
      fVar81 = fVar81 + fVar49;
      fVar52 = fVar52 + fVar53;
      auVar16._4_4_ = fVar79;
      auVar16._0_4_ = fVar77;
      auVar16._8_4_ = fVar81;
      auVar16._12_4_ = fVar52;
      auVar42 = minps(auVar42,auVar16);
      auVar17._4_4_ = fVar79;
      auVar17._0_4_ = fVar77;
      auVar17._8_4_ = fVar81;
      auVar17._12_4_ = fVar52;
      auVar63 = maxps(auVar63,auVar17);
      fVar71 = fVar71 + fVar46;
      fVar73 = fVar73 + fVar48;
      fVar74 = fVar74 + fVar49;
      fVar67 = fVar67 + fVar53;
      auVar24._4_4_ = fVar73;
      auVar24._0_4_ = fVar71;
      auVar24._8_4_ = fVar74;
      auVar24._12_4_ = fVar67;
      auVar42 = minps(auVar42,auVar24);
      auVar25._4_4_ = fVar73;
      auVar25._0_4_ = fVar71;
      auVar25._8_4_ = fVar74;
      auVar25._12_4_ = fVar67;
      auVar63 = maxps(auVar63,auVar25);
      auVar65._0_4_ = fVar66 + fVar46;
      auVar65._4_4_ = fVar68 + fVar48;
      auVar65._8_4_ = fVar69 + fVar49;
      auVar65._12_4_ = fVar70 + fVar53;
      auVar42 = minps(auVar42,auVar65);
      auVar63 = maxps(auVar63,auVar65);
      auVar57._0_4_ = fVar46 + fVar55;
      auVar57._4_4_ = fVar48 + fVar62;
      auVar57._8_4_ = fVar49 + fVar72;
      auVar57._12_4_ = fVar53 + fVar54;
      auVar42 = minps(auVar42,auVar57);
      auVar63 = maxps(auVar63,auVar57);
    }
    else {
      fVar41 = (pAVar6->l).vx.field_0.m128[0];
      fVar44 = (pAVar6->l).vx.field_0.m128[1];
      fVar45 = (pAVar6->l).vx.field_0.m128[2];
      fVar50 = (pAVar6->l).vx.field_0.m128[3];
      fVar78 = (pAVar6->l).vy.field_0.m128[0];
      fVar80 = (pAVar6->l).vy.field_0.m128[1];
      fVar82 = (pAVar6->l).vy.field_0.m128[2];
      fVar47 = (pAVar6->l).vy.field_0.m128[3];
      fVar46 = (pAVar6->l).vz.field_0.m128[0];
      fVar48 = (pAVar6->l).vz.field_0.m128[1];
      fVar49 = (pAVar6->l).vz.field_0.m128[2];
      fVar51 = (pAVar6->l).vz.field_0.m128[3];
      fVar56 = (pAVar6->p).field_0.m128[0];
      fVar58 = (pAVar6->p).field_0.m128[1];
      fVar59 = (pAVar6->p).field_0.m128[2];
      fVar60 = (pAVar6->p).field_0.m128[3];
      lVar7 = *(long *)&(pIVar5->super_Geometry).field_0x58;
      auVar63 = minps(*(undefined1 (*) [16])(lVar7 + 0x10),*(undefined1 (*) [16])(lVar7 + 0x30));
      auVar42 = maxps(*(undefined1 (*) [16])(lVar7 + 0x20),*(undefined1 (*) [16])(lVar7 + 0x40));
      fVar55 = auVar63._0_4_;
      fVar72 = auVar63._4_4_;
      fVar77 = auVar63._8_4_;
      fVar62 = fVar77 * fVar46 + fVar56;
      fVar66 = fVar77 * fVar48 + fVar58;
      fVar67 = fVar77 * fVar49 + fVar59;
      fVar68 = fVar77 * fVar51 + fVar60;
      fVar69 = fVar72 * fVar78;
      fVar70 = fVar72 * fVar80;
      fVar71 = fVar72 * fVar82;
      fVar72 = fVar72 * fVar47;
      fVar73 = fVar69 + fVar62;
      fVar74 = fVar70 + fVar66;
      fVar75 = fVar71 + fVar67;
      fVar76 = fVar72 + fVar68;
      fVar52 = fVar55 * fVar41;
      fVar53 = fVar55 * fVar44;
      fVar54 = fVar55 * fVar45;
      fVar55 = fVar55 * fVar50;
      fVar77 = fVar52 + fVar73;
      fVar79 = fVar53 + fVar74;
      fVar81 = fVar54 + fVar75;
      fVar84 = fVar55 + fVar76;
      auVar28._4_4_ = fVar79;
      auVar28._0_4_ = fVar77;
      auVar28._8_4_ = fVar81;
      auVar28._12_4_ = fVar84;
      auVar63 = minps(auVar30,auVar28);
      auVar29._4_4_ = fVar79;
      auVar29._0_4_ = fVar77;
      auVar29._8_4_ = fVar81;
      auVar29._12_4_ = fVar84;
      auVar61 = maxps((undefined1  [16])_DAT_01f45a40,auVar29);
      fVar77 = auVar42._0_4_;
      fVar79 = auVar42._4_4_;
      fVar81 = auVar42._8_4_;
      fVar56 = fVar81 * fVar46 + fVar56;
      fVar58 = fVar81 * fVar48 + fVar58;
      fVar59 = fVar81 * fVar49 + fVar59;
      fVar60 = fVar81 * fVar51 + fVar60;
      fVar69 = fVar69 + fVar56;
      fVar70 = fVar70 + fVar58;
      fVar71 = fVar71 + fVar59;
      fVar72 = fVar72 + fVar60;
      fVar46 = fVar52 + fVar69;
      fVar48 = fVar53 + fVar70;
      fVar49 = fVar54 + fVar71;
      fVar51 = fVar55 + fVar72;
      auVar9._4_4_ = fVar48;
      auVar9._0_4_ = fVar46;
      auVar9._8_4_ = fVar49;
      auVar9._12_4_ = fVar51;
      auVar42 = minps(auVar63,auVar9);
      auVar10._4_4_ = fVar48;
      auVar10._0_4_ = fVar46;
      auVar10._8_4_ = fVar49;
      auVar10._12_4_ = fVar51;
      auVar63 = maxps(auVar61,auVar10);
      fVar78 = fVar79 * fVar78;
      fVar80 = fVar79 * fVar80;
      fVar82 = fVar79 * fVar82;
      fVar79 = fVar79 * fVar47;
      fVar62 = fVar62 + fVar78;
      fVar66 = fVar66 + fVar80;
      fVar67 = fVar67 + fVar82;
      fVar68 = fVar68 + fVar79;
      fVar47 = fVar52 + fVar62;
      fVar46 = fVar53 + fVar66;
      fVar48 = fVar54 + fVar67;
      fVar49 = fVar55 + fVar68;
      auVar11._4_4_ = fVar46;
      auVar11._0_4_ = fVar47;
      auVar11._8_4_ = fVar48;
      auVar11._12_4_ = fVar49;
      auVar42 = minps(auVar42,auVar11);
      auVar12._4_4_ = fVar46;
      auVar12._0_4_ = fVar47;
      auVar12._8_4_ = fVar48;
      auVar12._12_4_ = fVar49;
      auVar63 = maxps(auVar63,auVar12);
      fVar78 = fVar78 + fVar56;
      fVar80 = fVar80 + fVar58;
      fVar82 = fVar82 + fVar59;
      fVar79 = fVar79 + fVar60;
      fVar52 = fVar52 + fVar78;
      fVar53 = fVar53 + fVar80;
      fVar54 = fVar54 + fVar82;
      fVar55 = fVar55 + fVar79;
      auVar13._4_4_ = fVar53;
      auVar13._0_4_ = fVar52;
      auVar13._8_4_ = fVar54;
      auVar13._12_4_ = fVar55;
      auVar42 = minps(auVar42,auVar13);
      auVar14._4_4_ = fVar53;
      auVar14._0_4_ = fVar52;
      auVar14._8_4_ = fVar54;
      auVar14._12_4_ = fVar55;
      auVar63 = maxps(auVar63,auVar14);
      fVar41 = fVar77 * fVar41;
      fVar44 = fVar77 * fVar44;
      fVar45 = fVar77 * fVar45;
      fVar77 = fVar77 * fVar50;
      fVar73 = fVar73 + fVar41;
      fVar74 = fVar74 + fVar44;
      fVar75 = fVar75 + fVar45;
      fVar76 = fVar76 + fVar77;
      auVar26._4_4_ = fVar74;
      auVar26._0_4_ = fVar73;
      auVar26._8_4_ = fVar75;
      auVar26._12_4_ = fVar76;
      auVar42 = minps(auVar42,auVar26);
      auVar27._4_4_ = fVar74;
      auVar27._0_4_ = fVar73;
      auVar27._8_4_ = fVar75;
      auVar27._12_4_ = fVar76;
      auVar63 = maxps(auVar63,auVar27);
      fVar69 = fVar69 + fVar41;
      fVar70 = fVar70 + fVar44;
      fVar71 = fVar71 + fVar45;
      fVar72 = fVar72 + fVar77;
      auVar22._4_4_ = fVar70;
      auVar22._0_4_ = fVar69;
      auVar22._8_4_ = fVar71;
      auVar22._12_4_ = fVar72;
      auVar42 = minps(auVar42,auVar22);
      auVar23._4_4_ = fVar70;
      auVar23._0_4_ = fVar69;
      auVar23._8_4_ = fVar71;
      auVar23._12_4_ = fVar72;
      auVar63 = maxps(auVar63,auVar23);
      auVar64._0_4_ = fVar62 + fVar41;
      auVar64._4_4_ = fVar66 + fVar44;
      auVar64._8_4_ = fVar67 + fVar45;
      auVar64._12_4_ = fVar68 + fVar77;
      auVar42 = minps(auVar42,auVar64);
      auVar63 = maxps(auVar63,auVar64);
      auVar43._0_4_ = fVar41 + fVar78;
      auVar43._4_4_ = fVar44 + fVar80;
      auVar43._8_4_ = fVar45 + fVar82;
      auVar43._12_4_ = fVar77 + fVar79;
      auVar42 = minps(auVar42,auVar43);
      auVar63 = maxps(auVar63,auVar43);
    }
    auVar38 = minps(auVar38,auVar42);
    aVar40.m128 = (__m128)maxps(aVar40.m128,auVar63);
    uVar3 = this->geomID_;
    *(Instance **)(pcVar31 + (long)pMVar36) = pIVar5;
    *(uint *)(pcVar31 + 8 + (long)pMVar36) = uVar3;
  }
  uVar32 = 7;
  if (uVar37 < 7) {
    uVar32 = uVar37;
  }
  aVar39._0_12_ = auVar38._0_12_;
  aVar39.m128[3] = (float)(current->_end - current->_begin);
  (__return_storage_ptr__->ref).ptr = uVar32 | (ulong)pcVar31 | 8;
  (__return_storage_ptr__->bounds).lower.field_0 = aVar39;
  (__return_storage_ptr__->bounds).upper.field_0 = aVar40;
  return __return_storage_ptr__;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items <= 1);
        
        /* allocate leaf node */
        InstancePrimitive* accel = (InstancePrimitive*) alloc.malloc1(items*sizeof(InstancePrimitive),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,items);
        const Instance* instance = this->mesh;
        
        BBox3fa bounds = empty;
        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index; 
          bounds.extend(instance->bounds(primID));
          new (&accel[i]) InstancePrimitive(instance, geomID_);
        }

        BBox3fx box_o = (BBox3fx&)bounds;
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }